

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# definitions.hxx
# Opt level: O3

void __thiscall
stateObservation::
IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
::writeInFile(IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *this,char *filename,bool clearLog,bool append)

{
  char cVar1;
  _Elt_pointer pMVar2;
  ostream *poVar3;
  runtime_error *this_00;
  ulong uVar4;
  _Map_pointer ppMVar5;
  _Elt_pointer pMVar6;
  _Map_pointer ppMVar7;
  ulong uVar8;
  _Elt_pointer pMVar9;
  _Elt_pointer pMVar10;
  long lVar11;
  long lVar12;
  Matrix<double,__1,_1,_0,__1,_1> *pMVar13;
  long lVar14;
  runtime_error e;
  ofstream f;
  stringstream ss;
  runtime_error local_3e8 [16];
  char *local_3d8;
  char local_3c8 [16];
  long local_3b8;
  filebuf local_3b0 [240];
  ios_base local_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::ofstream::ofstream((ofstream *)&local_3b8);
  std::ofstream::open((char *)&local_3b8,(_Ios_Openmode)filename);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Logger: File ",0xd);
    poVar3 = std::operator<<(local_1a8,filename);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," could not be created/opened.",0x1d);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(local_3e8,local_3d8);
    if (local_3d8 != local_3c8) {
      operator_delete(local_3d8);
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,local_3e8);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  ppMVar5 = (this->v_).
            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  ppMVar7 = (this->v_).
            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_node;
  uVar8 = (ulong)((long)ppMVar5 - (long)ppMVar7) >> 3;
  pMVar2 = (this->v_).
           super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  pMVar9 = (this->v_).
           super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_first;
  lVar11 = (long)pMVar2 - (long)pMVar9 >> 4;
  pMVar10 = (this->v_).
            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
  pMVar6 = (this->v_).
           super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_last;
  lVar12 = (long)pMVar6 - (long)pMVar10 >> 4;
  if ((0 < (long)(((uVar8 - 1) + (ulong)(ppMVar5 == (_Map_pointer)0x0)) * 0x20 + lVar11 + lVar12))
     && (lVar14 = this->k_,
        lVar14 < (long)(lVar11 + lVar14 + lVar12 +
                       ((uVar8 - 1) + (ulong)(ppMVar5 == (_Map_pointer)0x0)) * 0x20))) {
    do {
      std::ostream::_M_insert<long>((long)&local_3b8);
      ppMVar5 = (this->v_).
                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node;
      ppMVar7 = (this->v_).
                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node;
      pMVar2 = (this->v_).
               super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
      lVar11 = ((long)(this->v_).
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_last - (long)pMVar2 >> 4) +
               ((long)(this->v_).
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                (long)(this->v_).
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
               ((((ulong)((long)ppMVar5 - (long)ppMVar7) >> 3) - 1) +
               (ulong)(ppMVar5 == (_Map_pointer)0x0)) * 0x20;
      if (lVar11 == 0) {
LAB_00104742:
        __assert_fail("checkIndex(time) && \"Error: Time out of range\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/tools/definitions.hxx"
                      ,0x192,
                      "void stateObservation::IndexedMatrixArrayT<Eigen::Matrix<double, -1, 1>>::check_(TimeIndex) const [MatrixType = Eigen::Matrix<double, -1, 1>, Allocator = std::allocator<Eigen::Matrix<double, -1, 1>>]"
                     );
      }
      lVar12 = this->k_;
      if ((lVar14 < lVar12) || (lVar12 + lVar11 <= lVar14)) goto LAB_00104742;
      uVar8 = ((long)pMVar2 -
               (long)(this->v_).
                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) + (lVar14 - lVar12);
      if ((long)uVar8 < 0) {
        uVar4 = (long)uVar8 >> 5;
LAB_001045d0:
        pMVar13 = ppMVar7[uVar4] + uVar8 + uVar4 * -0x20;
      }
      else {
        if (0x1f < uVar8) {
          uVar4 = uVar8 >> 5;
          goto LAB_001045d0;
        }
        pMVar13 = pMVar2 + (lVar14 - lVar12);
      }
      if (0 < (pMVar13->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_rows) {
        lVar11 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_3b8," ",1);
          if ((pMVar13->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_rows <= lVar11) {
            __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                         );
          }
          std::ostream::_M_insert<double>
                    ((pMVar13->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_data[lVar11]);
          lVar11 = lVar11 + 1;
        } while (lVar11 < (pMVar13->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                          m_storage.m_rows);
      }
      cVar1 = (char)(ofstream *)&local_3b8;
      std::ios::widen((char)*(undefined8 *)(local_3b8 + -0x18) + cVar1);
      std::ostream::put(cVar1);
      std::ostream::flush();
      lVar14 = lVar14 + 1;
      ppMVar5 = (this->v_).
                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node;
      ppMVar7 = (this->v_).
                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node;
      pMVar2 = (this->v_).
               super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      pMVar9 = (this->v_).
               super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_first;
      pMVar10 = (this->v_).
                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur;
      pMVar6 = (this->v_).
               super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last;
    } while (lVar14 < (long)(((long)pMVar2 - (long)pMVar9 >> 4) + this->k_ +
                            ((long)pMVar6 - (long)pMVar10 >> 4) +
                            ((((ulong)((long)ppMVar5 - (long)ppMVar7) >> 3) - 1) +
                            (ulong)(ppMVar5 == (_Map_pointer)0x0)) * 0x20));
  }
  if (clearLog) {
    this->k_ = ((long)pMVar2 - (long)pMVar9 >> 4) + this->k_ +
               ((long)pMVar6 - (long)pMVar10 >> 4) +
               ((((ulong)((long)ppMVar5 - (long)ppMVar7) >> 3) - 1) +
               (ulong)(ppMVar5 == (_Map_pointer)0x0)) * 0x20;
    std::
    deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::clear(&this->v_);
  }
  local_3b8 = _VTT;
  *(undefined8 *)(local_3b0 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_3b0);
  std::ios_base::~ios_base(local_2c0);
  return;
}

Assistant:

void IndexedMatrixArrayT<MatrixType, Allocator>::writeInFile(const char * filename, bool clearLog, bool append)
{
  std::ofstream f;
  if (!append)
  {
    f.open(filename);
  }
  else
  {
    f.open(filename,std::ofstream::app);
  }

  if (f.is_open())
  {
    if (size()>0)
    {

      for (TimeIndex k=getFirstIndex(); k<getNextIndex(); ++k)
      {

        f << k;

        MatrixType & m = operator[](k);

        for (int i = 0 ; i< m.rows(); ++i)
        {
          for (int j = 0 ; j< m.cols(); ++j)
          {
            f << " "<< m(i,j);
          }
        }
        f << std::endl;
      }
    }

    if (clearLog)
    {
      clear();
    }
  }
  else
  {
    std::stringstream ss;
    ss<< "Logger: File " <<filename<<" could not be created/opened.";
    std::runtime_error e(ss.str().c_str());
    throw e;
  }

}